

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O2

int __thiscall UEFIToolApplication::startup(UEFIToolApplication *this)

{
  UEFITool *pUVar1;
  int iVar2;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  pUVar1 = this->tool;
  QCoreApplication::arguments();
  local_30.d = ((local_48.ptr)->d).d;
  local_30.ptr = ((local_48.ptr)->d).ptr;
  local_30.size = ((local_48.ptr)->d).size;
  if (local_30.d != (Data *)0x0) {
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::operator=(&pUVar1->currentProgramPath,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  QCoreApplication::arguments();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (1 < local_48.size) {
    pUVar1 = this->tool;
    QCoreApplication::arguments();
    local_60.d = local_48.ptr[1].d.d;
    local_60.ptr = local_48.ptr[1].d.ptr;
    local_60.size = local_48.ptr[1].d.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    UEFITool::openImageFile(pUVar1,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  QWidget::show();
  iVar2 = QApplication::exec();
  return iVar2;
}

Assistant:

int startup()
    {
        tool->setProgramPath(arguments().at(0));
        if (arguments().length() > 1)
            tool->openImageFile(arguments().at(1));
        tool->show();
        
        return exec();
    }